

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  size_t *psVar1;
  atomic<unsigned_long> *paVar2;
  char *pcVar3;
  float fVar4;
  undefined4 uVar5;
  BBox1f BVar6;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_> *pvVar7
  ;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar8;
  PrimRefMB *pPVar9;
  MemoryMonitorInterface *pMVar10;
  PrimRefVector pmVar11;
  code *pcVar12;
  ThreadLocal2 *pTVar13;
  NodeRefPtr<4> this_00;
  Scene *pSVar14;
  Geometry *pGVar15;
  float fVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar23;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar24;
  BuildRecord *pBVar25;
  Vec3fa VVar26;
  vuint<4> vVar27;
  undefined8 uVar28;
  byte bVar29;
  char cVar30;
  mvector<PrimRefMB> *prims;
  BBox1f BVar31;
  tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  tVar32;
  intrusive_list_node *piVar33;
  size_t sVar34;
  long lVar35;
  undefined8 *puVar36;
  runtime_error *prVar37;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *pvVar38;
  float *pfVar39;
  unsigned_long uVar40;
  range<unsigned_long> *prVar41;
  Split *pSVar42;
  ulong uVar43;
  PrimRefMB *pPVar44;
  char *pcVar45;
  int iVar46;
  task_group_context *ptVar47;
  size_t sVar48;
  long lVar49;
  uint uVar50;
  ulong uVar51;
  long lVar52;
  unsigned_long uVar53;
  size_t i_3;
  Split *pSVar54;
  ulong uVar55;
  byte bVar56;
  LocalChildListSplit *in_00;
  int iVar57;
  SetMB *this_01;
  int iVar58;
  size_t i_5;
  BBox1f *pBVar59;
  bool bVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar82;
  undefined1 auVar83 [16];
  float fVar84;
  float fVar85;
  float fVar90;
  float fVar91;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar92;
  undefined1 auVar89 [16];
  float fVar94;
  float fVar95;
  undefined1 auVar93 [16];
  float fVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar99;
  float fVar104;
  float fVar105;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar106;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 local_1ef8 [16];
  undefined8 uStack_1ef0;
  undefined1 local_1ee8 [16];
  ulong local_1ec8;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1eb8 [16];
  BBox1f time_range1;
  BBox1f time_range0;
  undefined1 local_1e78 [16];
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  local_1e48;
  PrimRefVector lprims;
  undefined8 local_1e38;
  float fStack_1e30;
  float fStack_1e2c;
  BBox<embree::Vec3fa> bi;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1e08;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aaStack_1df8 [9];
  anon_class_1_0_00000001 reduction;
  undefined1 local_1d48 [12];
  undefined4 uStack_1d3c;
  undefined1 local_1d38 [12];
  undefined4 uStack_1d2c;
  undefined1 local_1d28 [12];
  undefined4 uStack_1d1c;
  undefined1 local_1d18 [12];
  undefined4 uStack_1d0c;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_1c88 [16];
  vuint<4> v2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c28 [2];
  BBox1f local_1c08;
  BBox1f local_1c00;
  BBox1f local_1be0;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1bd8;
  BinSplit<32UL> local_1bc8;
  PrimInfoMB right;
  vuint<4> geomID;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ad8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ac8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ab8 [4];
  BBox1f local_1a78;
  size_t local_1a70;
  BBox1f local_1a50;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1a48;
  BinSplit<32UL> local_1a38;
  anon_class_24_3_c5d13451 isLeft;
  unsigned_long local_1998;
  unsigned_long local_1990;
  vint vSplitPos;
  float local_18e8;
  BuildRecordSplit current;
  NodeRecordMB4D values [16];
  LocalChildListSplit children;
  
  if ((this->cfg).maxDepth < in->depth) {
    puVar36 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&children,"depth limit reached",(allocator *)values);
    *puVar36 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar36 + 1) = 1;
    std::__cxx11::string::string((string *)(puVar36 + 2),(string *)&children);
    __cxa_throw(puVar36,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  children.children.items[0].super_BuildRecord._8_8_ =
       children.children.items[0].super_BuildRecord.depth;
  children.children.items[0].super_BuildRecord.depth = in->depth;
  SetMB::SetMB(&children.children.items[0].super_BuildRecord.prims,&in->prims);
  findFallback((Split *)values,this,&in->prims);
  BuildRecord::BuildRecord(&current.super_BuildRecord,(BuildRecord *)&children);
  auVar63 = values[0]._0_16_;
  current.split.sah = (float)values[0].ref.ptr;
  current.split.dim = (int)values[0].ref.ptr._4_4_;
  current.split.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)values[0]._8_4_;
  current.split.data = values[0]._12_4_;
  uVar28 = current.split._8_8_;
  current.split.mapping.ofs.field_0._0_8_ = values[0].lbounds.bounds0.upper.field_0._0_8_;
  current.split.mapping.ofs.field_0._8_8_ = values[0].lbounds.bounds0.upper.field_0._8_8_;
  current.split.mapping.scale.field_0._0_8_ = values[0].lbounds.bounds1.lower.field_0._0_8_;
  current.split.mapping.scale.field_0._8_8_ = values[0].lbounds.bounds1.lower.field_0._8_8_;
  uVar53 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
  if (current.super_BuildRecord.depth == 1) {
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end ==
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin) {
      bVar56 = 0;
      uVar53 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
    }
    else {
      lVar35 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin * 0x50 + 0x40;
      auVar64 = ZEXT816(0xff8000007f800000);
      for (uVar40 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
          uVar40 < current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
          uVar40 = uVar40 + 1) {
        auVar75._8_8_ = 0;
        auVar75._0_8_ =
             *(ulong *)((long)&((current.super_BuildRecord.prims.prims)->items->lbounds).bounds0.
                               lower.field_0 + lVar35);
        auVar76 = vcmpps_avx(auVar64,auVar75,1);
        auVar67 = vinsertps_avx(auVar64,auVar75,0x50);
        auVar64 = vblendps_avx(auVar75,auVar64,2);
        auVar64 = vblendvps_avx(auVar64,auVar67,auVar76);
        lVar35 = lVar35 + 0x50;
      }
      auVar76 = vmovshdup_avx(auVar64);
      auVar76 = vcmpps_avx(auVar76,ZEXT416((uint)current.super_BuildRecord.prims.super_PrimInfoMB.
                                                 time_range.upper),1);
      auVar64 = vcmpps_avx(ZEXT416((uint)current.super_BuildRecord.prims.super_PrimInfoMB.time_range
                                         .lower),auVar64,1);
      auVar64 = vorps_avx(auVar64,auVar76);
      bVar56 = auVar64[0] & 1;
    }
  }
  else {
    bVar56 = 0;
  }
  current.split._8_8_ = uVar28;
  if (((current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end - uVar53 <=
        (this->cfg).maxLeafSize) && (current.split.data = auVar63._12_4_, current.split.data < 2))
     && (bVar56 == 0)) {
    uVar55 = (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end - uVar53) + 3 >> 2;
    geomID.field_0.v[0] = uVar55 * 0x50;
    this_00.ptr = (size_t)(alloc.talloc1)->parent;
    values[0]._0_16_ = auVar63;
    if (alloc.alloc != (((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p) {
      values[0]._9_7_ = auVar63._9_7_;
      values[0]._8_1_ = 1;
      values[0].ref.ptr = this_00.ptr;
      MutexSys::lock((MutexSys *)this_00.ptr);
      if ((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p != (__pointer_type)0x0
         ) {
        LOCK();
        paVar2 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)(this_00.ptr + 0xa8) + (long)*(void **)(this_00.ptr + 0x68);
        UNLOCK();
        LOCK();
        paVar2 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((long)*(void **)(this_00.ptr + 0x58) + (long)*(void **)(this_00.ptr + 0x98)) -
             ((long)*(void **)(this_00.ptr + 0x50) + (long)*(void **)(this_00.ptr + 0x90)));
        UNLOCK();
        LOCK();
        paVar2 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesWasted
        ;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)(this_00.ptr + 0xb0) + (long)*(void **)(this_00.ptr + 0x70);
        UNLOCK();
      }
      auVar63 = ZEXT816(0) << 0x40;
      *(undefined1 (*) [32])(this_00.ptr + 0x58) = ZEXT1632(auVar63);
      *(undefined1 (*) [32])(this_00.ptr + 0x48) = ZEXT1632(auVar63);
      auVar69 = ZEXT1632(auVar63);
      if (alloc.alloc == (FastAllocator *)0x0) {
        *(undefined1 (*) [32])(this_00.ptr + 0x98) = auVar69;
        *(undefined1 (*) [32])(this_00.ptr + 0x88) = auVar69;
      }
      else {
        *(void **)(this_00.ptr + 0x60) = (void *)(alloc.alloc)->defaultBlockSize;
        *(undefined1 (*) [32])(this_00.ptr + 0x88) = auVar69;
        *(undefined1 (*) [32])(this_00.ptr + 0x98) = auVar69;
        *(void **)(this_00.ptr + 0xa0) = (void *)(alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p = alloc.alloc;
      UNLOCK();
      v2.field_0.v[0] = this_00.ptr;
      children.children.items[0].super_BuildRecord._8_1_ = 1;
      children.children.items[0].super_BuildRecord.depth =
           (size_t)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&v2);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&children);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)values);
    }
    uVar28 = geomID.field_0.v[0];
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + geomID.field_0.v[0];
    sVar34 = (alloc.talloc1)->cur;
    uVar51 = (ulong)(-(int)sVar34 & 0x1f);
    uVar43 = sVar34 + geomID.field_0.v[0] + uVar51;
    (alloc.talloc1)->cur = uVar43;
    if ((alloc.talloc1)->end < uVar43) {
      (alloc.talloc1)->cur = sVar34;
      uVar51 = (alloc.talloc1)->allocBlockSize;
      if ((ulong)(geomID.field_0.v[0] * 4) < uVar51 || geomID.field_0.v[0] * 4 - uVar51 == 0) {
        children.children.items[0].super_BuildRecord.depth = uVar51;
        pcVar45 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&children);
        (alloc.talloc1)->ptr = pcVar45;
        sVar34 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar34;
        (alloc.talloc1)->end = children.children.items[0].super_BuildRecord.depth;
        (alloc.talloc1)->cur = uVar28;
        if (children.children.items[0].super_BuildRecord.depth < (ulong)uVar28) {
          (alloc.talloc1)->cur = 0;
          children.children.items[0].super_BuildRecord.depth = (alloc.talloc1)->allocBlockSize;
          pcVar45 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&children);
          (alloc.talloc1)->ptr = pcVar45;
          sVar34 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar34;
          (alloc.talloc1)->end = children.children.items[0].super_BuildRecord.depth;
          (alloc.talloc1)->cur = uVar28;
          if (children.children.items[0].super_BuildRecord.depth < (ulong)uVar28) {
            (alloc.talloc1)->cur = 0;
            pcVar45 = (char *)0x0;
            goto LAB_00cb319c;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar34;
      }
      else {
        pcVar45 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&geomID);
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar51;
      pcVar45 = (alloc.talloc1)->ptr + (uVar43 - geomID.field_0._0_8_);
    }
LAB_00cb319c:
    uVar51 = 7;
    if (uVar55 < 7) {
      uVar51 = uVar55;
    }
    auVar79 = ZEXT1664(ZEXT816(0) << 0x40);
    local_1d18._8_4_ = 0x7f800000;
    local_1d18._0_8_ = 0x7f8000007f800000;
    uStack_1d0c = 0x7f800000;
    local_1d28._8_4_ = 0xff800000;
    local_1d28._0_8_ = 0xff800000ff800000;
    uStack_1d1c = 0xff800000;
    local_1d38._8_4_ = 0x7f800000;
    local_1d38._0_8_ = 0x7f8000007f800000;
    uStack_1d2c = 0x7f800000;
    local_1d48._8_4_ = 0xff800000;
    local_1d48._0_8_ = 0xff800000ff800000;
    uStack_1d3c = 0xff800000;
    for (uVar43 = 0; fVar16 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper,
        fVar4 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower,
        uVar40 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end,
        uVar43 != uVar55; uVar43 = uVar43 + 1) {
      pPVar9 = (current.super_BuildRecord.prims.prims)->items;
      pSVar14 = ((this->createLeaf).bvh)->scene;
      children.children.items[0].super_BuildRecord._0_16_ = (undefined1  [16])0x0;
      values[0]._0_16_ = (undefined1  [16])0x0;
      v2.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)0x0;
      bi.lower.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)
           vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      pPVar44 = pPVar9 + uVar53;
      geomID.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)bi.lower.field_0;
      for (lVar35 = 0; lVar35 != 0x10; lVar35 = lVar35 + 4) {
        if (uVar53 < uVar40) {
          fVar85 = (pPVar44->lbounds).bounds0.lower.field_0.m128[3];
          *(float *)((long)&geomID.field_0 + lVar35) = fVar85;
          fVar99 = (pPVar44->lbounds).bounds0.upper.field_0.m128[3];
          *(float *)((long)&bi.lower.field_0 + lVar35) = fVar99;
          pGVar15 = (pSVar14->geometries).items[(uint)fVar85].ptr;
          lVar49 = *(long *)&pGVar15->field_0x58;
          lVar52 = (ulong)(uint)fVar99 *
                   pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          uVar50 = *(uint *)&pGVar15[1].intersectionFilterN >> 2;
          *(uint *)((long)&children.children.items[0].super_BuildRecord.depth + lVar35) =
               *(int *)(lVar49 + lVar52) * uVar50;
          *(uint *)((long)&values[0].ref.ptr + lVar35) = *(int *)(lVar49 + 4 + lVar52) * uVar50;
          *(uint *)((long)&v2.field_0 + lVar35) = uVar50 * *(int *)(lVar49 + 8 + lVar52);
          uVar53 = uVar53 + 1;
        }
        else if (lVar35 != 0) {
          *(uint *)((long)&geomID.field_0 + lVar35) = geomID.field_0.i[0];
          *(undefined4 *)((long)&bi.lower.field_0 + lVar35) = 0xffffffff;
          uVar5 = (float)children.children.items[0].super_BuildRecord.depth;
          *(float *)((long)&children.children.items[0].super_BuildRecord.depth + lVar35) =
               (float)children.children.items[0].super_BuildRecord.depth;
          *(undefined4 *)((long)&values[0].ref.ptr + lVar35) = uVar5;
          *(undefined4 *)((long)&v2.field_0 + lVar35) = uVar5;
        }
        if (uVar53 < uVar40) {
          pPVar44 = pPVar9 + uVar53;
        }
      }
      lVar35 = uVar43 * 0x50;
      *(size_t *)(pcVar45 + lVar35) = children.children.items[0].super_BuildRecord.depth;
      *(undefined8 *)((long)(pcVar45 + lVar35) + 8) =
           children.children.items[0].super_BuildRecord._8_8_;
      *(size_t *)(pcVar45 + lVar35 + 0x10) = values[0].ref.ptr;
      *(undefined8 *)((long)(pcVar45 + lVar35 + 0x10) + 8) = values[0]._8_8_;
      *(longlong *)(pcVar45 + lVar35 + 0x20) = v2.field_0.v[0];
      *(longlong *)((long)(pcVar45 + lVar35 + 0x20) + 8) = v2.field_0.v[1];
      *(longlong *)(pcVar45 + lVar35 + 0x30) = geomID.field_0.v[0];
      *(longlong *)((long)(pcVar45 + lVar35 + 0x30) + 8) = geomID.field_0.v[1];
      *(undefined8 *)(pcVar45 + lVar35 + 0x40) = bi.lower.field_0._0_8_;
      *(undefined8 *)(pcVar45 + lVar35 + 0x40 + 8) = bi.lower.field_0._8_8_;
      auVar22._4_4_ = fVar16;
      auVar22._0_4_ = fVar4;
      auVar22._8_8_ = 0;
      auVar76 = vmovshdup_avx(auVar22);
      auVar70._8_4_ = 0x7f800000;
      auVar70._0_8_ = 0x7f8000007f800000;
      auVar70._12_4_ = 0x7f800000;
      auVar66._8_4_ = 0xff800000;
      auVar66._0_8_ = 0xff800000ff800000;
      auVar66._12_4_ = 0xff800000;
      lVar49 = 0;
      auVar64 = auVar70;
      auVar63 = auVar66;
      while ((lVar49 != 4 &&
             (isLeft.split = (Split *)(ulong)*(uint *)(pcVar45 + lVar49 * 4 + lVar35 + 0x40),
             isLeft.split != (Split *)0xffffffff))) {
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = (pSVar14->geometries).items[*(uint *)(pcVar45 + lVar49 * 4 + lVar35 + 0x30)].ptr;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = &isLeft;
        fVar16 = ((Geometry *)
                 right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_)->fnumTimeSegments;
        fVar85 = (((Geometry *)
                  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_)->time_range).lower;
        local_1e38._0_4_ =
             (((Geometry *)
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              _0_8_)->time_range).upper - fVar85;
        fVar82 = (fVar4 - fVar85) / (float)local_1e38;
        local_18e8 = auVar76._0_4_;
        local_1e38._0_4_ = (local_18e8 - fVar85) / (float)local_1e38;
        fVar85 = fVar16 * fVar82;
        fVar99 = fVar16 * (float)local_1e38;
        auVar65 = vroundss_avx(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85),9);
        auVar61 = vroundss_avx(ZEXT416((uint)fVar99),ZEXT416((uint)fVar99),10);
        auVar67 = vmaxss_avx(auVar65,auVar79._0_16_);
        auVar75 = vminss_avx(auVar61,ZEXT416((uint)fVar16));
        iVar46 = (int)auVar67._0_4_;
        fVar72 = auVar75._0_4_;
        iVar57 = (int)auVar65._0_4_;
        iVar58 = -1;
        if (-1 < iVar57) {
          iVar58 = iVar57;
        }
        iVar17 = (int)fVar16 + 1;
        if ((int)auVar61._0_4_ < (int)fVar16 + 1) {
          iVar17 = (int)auVar61._0_4_;
        }
        TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                  ((BBox3fa *)&children,(anon_class_16_2_4e716a3c *)&right,(long)iVar46);
        TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                  ((BBox3fa *)values,(anon_class_16_2_4e716a3c *)&right,(long)(int)fVar72);
        fVar85 = fVar85 - auVar67._0_4_;
        if (iVar17 - iVar58 == 1) {
          auVar67 = vmaxss_avx(ZEXT416((uint)fVar85),ZEXT816(0) << 0x40);
          auVar75 = vshufps_avx(auVar67,auVar67,0);
          auVar67 = ZEXT416((uint)(1.0 - auVar67._0_4_));
          auVar67 = vshufps_avx(auVar67,auVar67,0);
          auVar93._0_4_ =
               auVar75._0_4_ * (float)values[0].ref.ptr +
               auVar67._0_4_ * (float)children.children.items[0].super_BuildRecord.depth;
          auVar93._4_4_ =
               auVar75._4_4_ * values[0].ref.ptr._4_4_ +
               auVar67._4_4_ * children.children.items[0].super_BuildRecord.depth._4_4_;
          auVar93._8_4_ =
               auVar75._8_4_ * (float)values[0]._8_4_ +
               auVar67._8_4_ * (float)children.children.items[0].super_BuildRecord._8_4_;
          auVar93._12_4_ =
               auVar75._12_4_ * (float)values[0]._12_4_ +
               auVar67._12_4_ * (float)children.children.items[0].super_BuildRecord._12_4_;
          auVar101._0_4_ =
               auVar75._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._0_4_ +
               auVar67._0_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [0];
          auVar101._4_4_ =
               auVar75._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._4_4_ +
               auVar67._4_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [1];
          auVar101._8_4_ =
               auVar75._8_4_ * (float)values[0].lbounds.bounds0.lower.field_0._8_4_ +
               auVar67._8_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [2];
          auVar101._12_4_ =
               auVar75._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._12_4_ +
               auVar67._12_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [3];
          auVar67 = vmaxss_avx(ZEXT416((uint)(fVar72 - fVar99)),ZEXT816(0) << 0x40);
          auVar75 = vshufps_avx(auVar67,auVar67,0);
          auVar67 = ZEXT416((uint)(1.0 - auVar67._0_4_));
          auVar67 = vshufps_avx(auVar67,auVar67,0);
          auVar83._0_4_ =
               auVar67._0_4_ * (float)values[0].ref.ptr +
               auVar75._0_4_ * (float)children.children.items[0].super_BuildRecord.depth;
          auVar83._4_4_ =
               auVar67._4_4_ * values[0].ref.ptr._4_4_ +
               auVar75._4_4_ * children.children.items[0].super_BuildRecord.depth._4_4_;
          auVar83._8_4_ =
               auVar67._8_4_ * (float)values[0]._8_4_ +
               auVar75._8_4_ * (float)children.children.items[0].super_BuildRecord._8_4_;
          auVar83._12_4_ =
               auVar67._12_4_ * (float)values[0]._12_4_ +
               auVar75._12_4_ * (float)children.children.items[0].super_BuildRecord._12_4_;
          auVar88._0_4_ =
               auVar67._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._0_4_ +
               auVar75._0_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [0];
          auVar88._4_4_ =
               auVar67._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._4_4_ +
               auVar75._4_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [1];
          auVar88._8_4_ =
               auVar67._8_4_ * (float)values[0].lbounds.bounds0.lower.field_0._8_4_ +
               auVar75._8_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [2];
          auVar88._12_4_ =
               auVar67._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._12_4_ +
               auVar75._12_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [3];
        }
        else {
          TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                    ((BBox3fa *)&v2,(anon_class_16_2_4e716a3c *)&right,(long)(iVar46 + 1));
          TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                    ((BBox3fa *)&geomID,(anon_class_16_2_4e716a3c *)&right,(long)((int)fVar72 + -1))
          ;
          auVar67 = vmaxss_avx(ZEXT416((uint)fVar85),ZEXT816(0) << 0x40);
          auVar75 = vshufps_avx(auVar67,auVar67,0);
          auVar67 = ZEXT416((uint)(1.0 - auVar67._0_4_));
          auVar67 = vshufps_avx(auVar67,auVar67,0);
          auVar93._0_4_ =
               auVar75._0_4_ * (float)v2.field_0.i[0] +
               auVar67._0_4_ * (float)children.children.items[0].super_BuildRecord.depth;
          auVar93._4_4_ =
               auVar75._4_4_ * (float)v2.field_0.i[1] +
               auVar67._4_4_ * children.children.items[0].super_BuildRecord.depth._4_4_;
          auVar93._8_4_ =
               auVar75._8_4_ * (float)v2.field_0.i[2] +
               auVar67._8_4_ * (float)children.children.items[0].super_BuildRecord._8_4_;
          auVar93._12_4_ =
               auVar75._12_4_ * (float)v2.field_0.i[3] +
               auVar67._12_4_ * (float)children.children.items[0].super_BuildRecord._12_4_;
          auVar101._0_4_ =
               auVar75._0_4_ * local_1c68.m128[0] +
               auVar67._0_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [0];
          auVar101._4_4_ =
               auVar75._4_4_ * local_1c68.m128[1] +
               auVar67._4_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [1];
          auVar101._8_4_ =
               auVar75._8_4_ * local_1c68.m128[2] +
               auVar67._8_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [2];
          auVar101._12_4_ =
               auVar75._12_4_ * local_1c68.m128[3] +
               auVar67._12_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [3];
          auVar67 = vmaxss_avx(ZEXT416((uint)(fVar72 - fVar99)),ZEXT816(0) << 0x40);
          auVar75 = vshufps_avx(auVar67,auVar67,0);
          auVar67 = ZEXT416((uint)(1.0 - auVar67._0_4_));
          auVar67 = vshufps_avx(auVar67,auVar67,0);
          auVar83._0_4_ =
               auVar75._0_4_ * (float)geomID.field_0.i[0] + auVar67._0_4_ * (float)values[0].ref.ptr
          ;
          auVar83._4_4_ =
               auVar75._4_4_ * (float)geomID.field_0.i[1] + auVar67._4_4_ * values[0].ref.ptr._4_4_;
          auVar83._8_4_ =
               auVar75._8_4_ * (float)geomID.field_0.i[2] + auVar67._8_4_ * (float)values[0]._8_4_;
          auVar83._12_4_ =
               auVar75._12_4_ * (float)geomID.field_0.i[3] +
               auVar67._12_4_ * (float)values[0]._12_4_;
          auVar88._0_4_ =
               auVar75._0_4_ * local_1ad8.m128[0] +
               auVar67._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
          auVar88._4_4_ =
               auVar75._4_4_ * local_1ad8.m128[1] +
               auVar67._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
          auVar88._8_4_ =
               auVar75._8_4_ * local_1ad8.m128[2] +
               auVar67._8_4_ * (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
          auVar88._12_4_ =
               auVar75._12_4_ * local_1ad8.m128[3] +
               auVar67._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
          if (iVar57 < 0) {
            iVar57 = -1;
          }
          fVar85 = (float)local_1e38 - fVar82;
          sVar34 = (size_t)iVar57;
          while (sVar34 = sVar34 + 1, (long)sVar34 < (long)iVar17) {
            auVar68._0_4_ = ((float)(int)sVar34 / fVar16 - fVar82) / fVar85;
            auVar68._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar67 = vshufps_avx(auVar68,auVar68,0);
            fVar99 = auVar83._4_4_;
            fVar72 = auVar83._8_4_;
            fVar84 = auVar83._12_4_;
            auVar75 = vshufps_avx(ZEXT416((uint)(1.0 - auVar68._0_4_)),
                                  ZEXT416((uint)(1.0 - auVar68._0_4_)),0);
            fVar94 = auVar93._4_4_;
            fVar95 = auVar93._8_4_;
            fVar96 = auVar93._12_4_;
            local_1e38._0_4_ = auVar83._0_4_ * auVar67._0_4_ + auVar93._0_4_ * auVar75._0_4_;
            local_1e38._4_4_ = fVar99 * auVar67._4_4_ + fVar94 * auVar75._4_4_;
            fStack_1e30 = fVar72 * auVar67._8_4_ + fVar95 * auVar75._8_4_;
            fStack_1e2c = fVar84 * auVar67._12_4_ + fVar96 * auVar75._12_4_;
            fVar90 = auVar88._4_4_;
            fVar91 = auVar88._8_4_;
            fVar92 = auVar88._12_4_;
            fVar104 = auVar101._4_4_;
            fVar105 = auVar101._8_4_;
            fVar106 = auVar101._12_4_;
            TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                      (&bi,(anon_class_16_2_4e716a3c *)&right,sVar34);
            auVar19._4_4_ = local_1e38._4_4_;
            auVar19._0_4_ = (float)local_1e38;
            auVar19._8_4_ = fStack_1e30;
            auVar19._12_4_ = fStack_1e2c;
            auVar65 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar19);
            auVar20._4_4_ = bi.upper.field_0.m128[1];
            auVar20._0_4_ = bi.upper.field_0.m128[0];
            auVar20._8_4_ = bi.upper.field_0.m128[2];
            auVar20._12_4_ = bi.upper.field_0.m128[3];
            auVar18._4_4_ = fVar90 * auVar67._4_4_ + fVar104 * auVar75._4_4_;
            auVar18._0_4_ = auVar88._0_4_ * auVar67._0_4_ + auVar101._0_4_ * auVar75._0_4_;
            auVar18._8_4_ = fVar91 * auVar67._8_4_ + fVar105 * auVar75._8_4_;
            auVar18._12_4_ = fVar92 * auVar67._12_4_ + fVar106 * auVar75._12_4_;
            auVar67 = vsubps_avx(auVar20,auVar18);
            auVar75 = vminps_avx(auVar65,ZEXT816(0) << 0x40);
            auVar67 = vmaxps_avx(auVar67,ZEXT816(0) << 0x40);
            auVar93._0_4_ = auVar93._0_4_ + auVar75._0_4_;
            auVar93._4_4_ = fVar94 + auVar75._4_4_;
            auVar93._8_4_ = fVar95 + auVar75._8_4_;
            auVar93._12_4_ = fVar96 + auVar75._12_4_;
            auVar83._0_4_ = auVar83._0_4_ + auVar75._0_4_;
            auVar83._4_4_ = fVar99 + auVar75._4_4_;
            auVar83._8_4_ = fVar72 + auVar75._8_4_;
            auVar83._12_4_ = fVar84 + auVar75._12_4_;
            auVar101._0_4_ = auVar101._0_4_ + auVar67._0_4_;
            auVar101._4_4_ = fVar104 + auVar67._4_4_;
            auVar101._8_4_ = fVar105 + auVar67._8_4_;
            auVar101._12_4_ = fVar106 + auVar67._12_4_;
            auVar88._0_4_ = auVar88._0_4_ + auVar67._0_4_;
            auVar88._4_4_ = fVar90 + auVar67._4_4_;
            auVar88._8_4_ = fVar91 + auVar67._8_4_;
            auVar88._12_4_ = fVar92 + auVar67._12_4_;
          }
        }
        auVar64 = vminps_avx(auVar64,auVar93);
        auVar66 = vmaxps_avx(auVar66,auVar101);
        auVar70 = vminps_avx(auVar70,auVar83);
        auVar63 = vmaxps_avx(auVar63,auVar88);
        lVar49 = lVar49 + 1;
        auVar79 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      _local_1d18 = vminps_avx(_local_1d18,auVar64);
      _local_1d28 = vmaxps_avx(_local_1d28,auVar66);
      _local_1d38 = vminps_avx(_local_1d38,auVar70);
      _local_1d48 = vmaxps_avx(_local_1d48,auVar63);
    }
    (__return_storage_ptr__->ref).ptr = uVar51 | (ulong)pcVar45 | 8;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1d18._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         stack0xffffffffffffe2f0;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1d28._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         stack0xffffffffffffe2e0;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1d38._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         stack0xffffffffffffe2d0;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1d48._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
         stack0xffffffffffffe2c0;
    BVar31.upper = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
    BVar31.lower = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
    __return_storage_ptr__->dt = BVar31;
    return __return_storage_ptr__;
  }
  local_1e38 = &children;
  array_t<embree::avx::BVHBuilderMSMBlur::BuildRecordSplit,_16UL>::array_t
            ((array_t<embree::avx::BVHBuilderMSMBlur::BuildRecordSplit,_16UL> *)&children);
  children.numChildren = 1;
  local_1ec8 = 1;
  children.numSharedPrimVecs = 1;
  BuildRecordSplit::operator=((BuildRecordSplit *)&children,&current);
  children.sharedPrimVecs.items[0].prims = current.super_BuildRecord.prims.prims;
  children.sharedPrimVecs.items[0].refCount = 2;
  children.primvecs.items[0] = children.sharedPrimVecs.items;
  bVar29 = 0;
  local_1e78._8_4_ = 0x7f800000;
  local_1e78._0_8_ = 0x7f8000007f800000;
  local_1e78._12_4_ = 0x7f800000;
  local_1eb8._8_4_ = 0xff800000;
  local_1eb8._0_8_ = 0xff800000ff800000;
  local_1eb8._12_4_ = 0xff800000;
  do {
    prVar41 = &children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.object_range;
    uVar55 = 0;
    sVar34 = 0xffffffffffffffff;
    for (sVar48 = 0; children.numChildren != sVar48; sVar48 = sVar48 + 1) {
      uVar51 = prVar41->_end - prVar41->_begin;
      if ((((this->cfg).maxLeafSize < uVar51) || (1 < *(uint *)((long)(prVar41 + 4) + 0xc))) ||
         (bVar56 != 0)) {
        if (uVar55 < uVar51) {
          sVar34 = sVar48;
          uVar55 = uVar51;
        }
        bVar56 = 0;
      }
      prVar41 = prVar41 + 0xf;
    }
    if (sVar34 == 0xffffffffffffffff) break;
    v2.field_0.v[0] = current.super_BuildRecord.depth + 1;
    local_1bc8.sah = INFINITY;
    local_1bc8.dim = -1;
    local_1bc8.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)0x0;
    local_1bc8.data = 0;
    geomID.field_0.v[0] = current.super_BuildRecord.depth + 1;
    local_1a38.sah = INFINITY;
    local_1a38.dim = -1;
    local_1a38.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)0x0;
    local_1a38.data = 0;
    uVar50 = children.children.items[sVar34].split.data;
    if (3 < uVar50) goto LAB_00cb1fec;
    this_01 = &children.children.items[sVar34].super_BuildRecord.prims;
    switch(uVar50) {
    case 0:
      isLeft.split = &children.children.items[sVar34].split;
      BVar6 = (BBox1f)children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.
                      object_range._begin;
      bi.lower.field_0.m128[2] = INFINITY;
      bi.lower.field_0._0_8_ = 0x7f8000007f800000;
      bi.lower.field_0.m128[3] = INFINITY;
      bi.upper.field_0.m128[0] = -INFINITY;
      bi.upper.field_0.m128[1] = -INFINITY;
      bi.upper.field_0.m128[2] = -INFINITY;
      bi.upper.field_0.m128[3] = -INFINITY;
      local_1e08.i[0] = 0x7f800000;
      local_1e08.i[1] = 0x7f800000;
      local_1e08.i[2] = 0x7f800000;
      local_1e08.i[3] = 0x7f800000;
      aaStack_1df8[0].i[0] = -INFINITY;
      aaStack_1df8[0].i[1] = -INFINITY;
      aaStack_1df8[0].i[2] = -INFINITY;
      aaStack_1df8[0].i[3] = -INFINITY;
      auVar76._8_4_ = 0x3f800000;
      auVar76._0_8_ = 0x3f8000003f800000;
      auVar76._12_4_ = 0x3f800000;
      vmovlps_avx(auVar76);
      sVar48 = children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      right.max_time_range.lower = 0.0;
      right._132_8_ = vmovlps_avx(auVar76);
      right.time_range.upper = 0.0;
      vSplitPos.field_0.i[1] = children.children.items[sVar34].split.field_2.pos;
      vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
      lVar35 = (long)(1 << ((byte)children.children.items[sVar34].split.dim & 0x1f)) * 0x10;
      vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar35);
      vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar35 + 8);
      isLeft.vSplitPos = &vSplitPos;
      isLeft.vSplitMask = &vSplitMask;
      BVar31 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                 ((children.children.items[sVar34].super_BuildRecord.prims.prims)->
                                  items,(size_t)BVar6,sVar48,(EmptyTy *)local_1c88,
                                  (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bi,&right,&isLeft,
                                  &reduction,&reduction2,0x80,0xc00);
      pvVar38 = children.children.items[sVar34].super_BuildRecord.prims.prims;
      pBVar25 = &children.children.items[sVar34].super_BuildRecord;
      uStack_1ef0 = 0;
      local_1ef8._0_4_ = (pBVar25->prims).super_PrimInfoMB.time_range.lower;
      local_1ef8._4_4_ = (pBVar25->prims).super_PrimInfoMB.time_range.upper;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1c68.field_1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bi);
      auVar61._8_8_ = 0;
      auVar61._0_4_ = local_1be0.lower;
      auVar61._4_4_ = local_1be0.upper;
      auVar64 = vcmpps_avx(auVar61,local_1ef8,1);
      auVar76 = vinsertps_avx(local_1ef8,auVar61,0x50);
      auVar63 = vblendps_avx(auVar61,local_1ef8,2);
      auVar63 = vblendvps_avx(auVar63,auVar76,auVar64);
      local_1be0 = (BBox1f)vmovlps_avx(auVar63);
      pvVar7 = children.children.items[sVar34].super_BuildRecord.prims.prims;
      pBVar25 = &children.children.items[sVar34].super_BuildRecord;
      uStack_1ef0 = 0;
      local_1ef8._0_4_ = (pBVar25->prims).super_PrimInfoMB.time_range.lower;
      local_1ef8._4_4_ = (pBVar25->prims).super_PrimInfoMB.time_range.upper;
      local_1c08 = BVar6;
      local_1c00 = BVar31;
      local_1bd8 = pvVar38;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1ad8.field_1,&right);
      auVar62._8_8_ = 0;
      auVar62._0_4_ = local_1a50.lower;
      auVar62._4_4_ = local_1a50.upper;
      auVar64 = vcmpps_avx(auVar62,local_1ef8,1);
      auVar76 = vinsertps_avx(local_1ef8,auVar62,0x50);
      auVar63 = vblendps_avx(auVar62,local_1ef8,2);
      auVar63 = vblendvps_avx(auVar63,auVar76,auVar64);
      local_1a50 = (BBox1f)vmovlps_avx(auVar63);
      local_1a78 = BVar31;
      local_1a70 = sVar48;
      local_1a48 = pvVar7;
      break;
    case 1:
      SetMB::deterministic_order(this_01);
      splitFallback(this,this_01,(SetMB *)&local_1c68.field_1,(SetMB *)&local_1ad8.field_1);
      break;
    case 2:
      time_range1.lower = children.children.items[sVar34].split.field_2.fpos;
      time_range0.lower =
           children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.time_range.lower
      ;
      time_range1.upper =
           children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.time_range.upper
      ;
      pmVar11 = children.children.items[sVar34].super_BuildRecord.prims.prims;
      time_range0.upper = time_range1.lower;
      tVar32.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )::operator_new(0x28);
      pMVar10 = (this->heuristicTemporalSplit).device;
      ((intrusive_list_node *)
      ((long)tVar32.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl + 0x20))->my_prev_node = (intrusive_list_node *)0x0;
      pSVar42 = (Split *)children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.
                         object_range._end;
      uVar53 = children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      *(MemoryMonitorInterface **)
       tVar32.
       super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       .
       super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
       ._M_head_impl = pMVar10;
      *(undefined1 *)
       &(((atomic<unsigned_int> *)
         ((long)tVar32.
                super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                .
                super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                ._M_head_impl + 8))->super___atomic_base<unsigned_int>)._M_i = 0;
      ((anon_union_8_2_d71db6ad_for_task_group_context_11 *)
      ((long)tVar32.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl + 0x10))->my_parent = (task_group_context *)0x0;
      *(context_list **)
       ((long)tVar32.
              super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              .
              super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
              ._M_head_impl + 0x18) = (context_list *)0x0;
      ptVar47 = (task_group_context *)((long)pSVar42 - uVar53);
      pSVar54 = pSVar42;
      if (ptVar47 != (task_group_context *)0x0) {
        uVar55 = (long)ptVar47 * 0x50;
        (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,uVar55,0);
        if (uVar55 < 0x1c00000) {
          piVar33 = (intrusive_list_node *)alignedMalloc(uVar55,0x10);
        }
        else {
          piVar33 = (intrusive_list_node *)
                    os_malloc(uVar55,(bool *)((long)tVar32.
                                                  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                                  ._M_head_impl + 8));
        }
        ((intrusive_list_node *)
        ((long)tVar32.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl + 0x20))->my_prev_node = piVar33;
        ((anon_union_8_2_d71db6ad_for_task_group_context_11 *)
        ((long)tVar32.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl + 0x10))->my_parent = ptVar47;
        *(task_group_context **)
         ((long)tVar32.
                super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                .
                super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                ._M_head_impl + 0x18) = ptVar47;
        pSVar42 = (Split *)children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.
                           object_range._begin;
        pSVar54 = (Split *)children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.
                           object_range._end;
        local_1ef8._0_8_ =
             (tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )(tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )tVar32.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl;
      }
      vSplitMask.field_0._8_8_ = &time_range0;
      bi.lower.field_0.m128[2] = INFINITY;
      bi.lower.field_0._0_8_ = 0x7f8000007f800000;
      bi.lower.field_0.m128[3] = INFINITY;
      bi.upper.field_0.m128[0] = -INFINITY;
      bi.upper.field_0.m128[1] = -INFINITY;
      bi.upper.field_0.m128[2] = -INFINITY;
      bi.upper.field_0.m128[3] = -INFINITY;
      auVar63._8_4_ = 0x3f800000;
      auVar63._0_8_ = 0x3f8000003f800000;
      auVar63._12_4_ = 0x3f800000;
      uVar55 = vmovlps_avx(auVar63);
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )tVar32.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      lprims = (PrimRefVector)
               tVar32.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      vSplitMask.field_0._0_8_ = pmVar11;
      if ((ulong)((long)pSVar54 - (long)pSVar42) < 0xc00) {
        isLeft.split = pSVar42;
        isLeft.vSplitPos = (vint *)pSVar54;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  (&right,(anon_class_40_5_808acc65 *)&vSplitMask,(range<unsigned_long> *)&isLeft);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&isLeft,(context_traits)0x4,CUSTOM_CTX);
        _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        vSplitPos.field_0.v[0] = (longlong)pSVar54;
        vSplitPos.field_0.v[1] = (longlong)pSVar42;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&right,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&bi,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&isLeft,(task_group_context *)local_1ef8._0_8_);
        cVar30 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
        if (cVar30 != '\0') {
          prVar37 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar37,"task cancelled");
          __cxa_throw(prVar37,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&isLeft);
      }
      uVar53 = children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end - children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.
                       object_range._begin;
      if (right.object_range._end - right.object_range._begin != uVar53) {
        bi.lower.field_0._0_8_ = &time_range0;
        right.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                       (lprims->items,0,uVar53,0x400,(anon_class_8_1_41ce32a5 *)&bi);
      }
      ptVar47 = (task_group_context *)CONCAT44(time_range0.upper,time_range0.lower);
      uStack_1ef0 = 0;
      local_1ef8._0_8_ =
           (tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )(tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )ptVar47;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bi,&right);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = uVar55 >> 0x20;
      auVar64 = vcmpps_avx(auVar67,local_1ef8,1);
      auVar76 = vinsertps_avx(local_1ef8,auVar67,0x50);
      auVar63 = vblendps_avx(auVar67,local_1ef8,2);
      auVar63 = vblendvps_avx(auVar63,auVar76,auVar64);
      vmovlps_avx(auVar63);
      SetMB::operator=((SetMB *)&local_1c68.field_1,(SetMB *)&bi);
      uVar53 = children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      bi.lower.field_0.m128[2] = INFINITY;
      bi.lower.field_0._0_8_ = 0x7f8000007f800000;
      bi.lower.field_0.m128[3] = INFINITY;
      bi.upper.field_0.m128[0] = -INFINITY;
      bi.upper.field_0.m128[1] = -INFINITY;
      bi.upper.field_0.m128[2] = -INFINITY;
      bi.upper.field_0.m128[3] = -INFINITY;
      local_1e08.i[0] = 0x7f800000;
      local_1e08.i[1] = 0x7f800000;
      local_1e08.i[2] = 0x7f800000;
      local_1e08.i[3] = 0x7f800000;
      aaStack_1df8[0].i[0] = -INFINITY;
      aaStack_1df8[0].i[1] = -INFINITY;
      aaStack_1df8[0].i[2] = -INFINITY;
      aaStack_1df8[0].i[3] = -INFINITY;
      auVar64._8_4_ = 0x3f800000;
      auVar64._0_8_ = 0x3f8000003f800000;
      auVar64._12_4_ = 0x3f800000;
      uVar55 = vmovlps_avx(auVar64);
      pcVar12 = (code *)children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.
                        object_range._end;
      _reduction2 = pmVar11;
      if ((long)pcVar12 - uVar53 < 0xc00) {
        vSplitPos.field_0.v[0] = uVar53;
        vSplitPos.field_0.v[1] = (longlong)pcVar12;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  ((PrimInfoMB *)&isLeft,(anon_class_24_3_35f68c7c *)&reduction2,
                   (range<unsigned_long> *)&vSplitPos);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&vSplitPos,(context_traits)0x4,CUSTOM_CTX);
        local_1c88._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1c88._8_8_ = &reduction2;
        _reduction = pcVar12;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft,(d1 *)&reduction,
                   (blocked_range<unsigned_long> *)&bi,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1c88,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos,ptVar47);
        cVar30 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
        if (cVar30 != '\0') {
          prVar37 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar37,"task cancelled");
          __cxa_throw(prVar37,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&vSplitPos);
      }
      lVar35 = local_1990 - local_1998;
      local_1998 = children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.
                   object_range._begin;
      local_1990 = lVar35 + local_1998;
      uVar53 = children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end;
      if (lVar35 != uVar53 - local_1998) {
        bi.lower.field_0._0_8_ = &time_range1;
        local_1990 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                               (pmVar11->items,local_1998,uVar53,0x400,
                                (anon_class_8_1_41ce32a6 *)&bi);
      }
      local_1ef8._4_4_ = time_range1.upper;
      local_1ef8._0_4_ = time_range1.lower;
      uStack_1ef0 = 0;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bi,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = uVar55 >> 0x20;
      auVar64 = vcmpps_avx(auVar65,local_1ef8,1);
      auVar76 = vinsertps_avx(local_1ef8,auVar65,0x50);
      auVar63 = vblendps_avx(auVar65,local_1ef8,2);
      auVar63 = vblendvps_avx(auVar63,auVar76,auVar64);
      vmovlps_avx(auVar63);
      SetMB::operator=((SetMB *)&local_1ad8.field_1,(SetMB *)&bi);
      bVar60 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      goto LAB_00cb1ffc;
    case 3:
      SetMB::deterministic_order(this_01);
      splitByGeometry(this,this_01,(SetMB *)&local_1c68.field_1,(SetMB *)&local_1ad8.field_1);
    }
LAB_00cb1fec:
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    bVar60 = false;
LAB_00cb1ffc:
    findFallback((Split *)&bi,this,(SetMB *)&local_1c68.field_1);
    VVar26 = bi.lower;
    local_1bc8.sah = (float)bi.lower.field_0._0_4_;
    local_1bc8.dim = bi.lower.field_0._4_4_;
    local_1bc8.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)bi.lower.field_0._8_4_;
    local_1bc8.data = bi.lower.field_0._12_4_;
    local_1bc8.mapping.num = CONCAT44(bi.upper.field_0.m128[1],bi.upper.field_0.m128[0]);
    local_1bc8.mapping.ofs.field_0._0_8_ = CONCAT44(local_1e08.i[1],local_1e08.i[0]);
    local_1bc8.mapping.ofs.field_0._8_8_ = CONCAT44(local_1e08.i[3],local_1e08.i[2]);
    local_1bc8.mapping.scale.field_0._0_8_ = CONCAT44(aaStack_1df8[0].i[1],aaStack_1df8[0].i[0]);
    local_1bc8.mapping.scale.field_0._8_8_ = CONCAT44(aaStack_1df8[0].i[3],aaStack_1df8[0].i[2]);
    bi.lower = VVar26;
    findFallback((Split *)&bi,this,(SetMB *)&local_1ad8.field_1);
    sVar48 = children.numSharedPrimVecs;
    VVar26 = bi.lower;
    local_1a38.sah = (float)bi.lower.field_0._0_4_;
    local_1a38.dim = bi.lower.field_0._4_4_;
    local_1a38.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)bi.lower.field_0._8_4_;
    local_1a38.data = bi.lower.field_0._12_4_;
    local_1a38.mapping.num = CONCAT44(bi.upper.field_0.m128[1],bi.upper.field_0.m128[0]);
    local_1a38.mapping.ofs.field_0._0_8_ = CONCAT44(local_1e08.i[1],local_1e08.i[0]);
    local_1a38.mapping.ofs.field_0._8_8_ = CONCAT44(local_1e08.i[3],local_1e08.i[2]);
    local_1a38.mapping.scale.field_0._0_8_ = CONCAT44(aaStack_1df8[0].i[1],aaStack_1df8[0].i[0]);
    local_1a38.mapping.scale.field_0._8_8_ = CONCAT44(aaStack_1df8[0].i[3],aaStack_1df8[0].i[2]);
    local_1e48._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl;
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    pSVar8 = children.primvecs.items[sVar34];
    if (local_1bd8 == pSVar8->prims) {
      pSVar8->refCount = pSVar8->refCount + 1;
      pvVar38 = local_1bd8;
    }
    else {
      pSVar23 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar24 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar24->prims = local_1bd8;
      children.sharedPrimVecs.items[sVar48].refCount = 1;
      children.primvecs.items[sVar34] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar23->prims;
      pvVar38 = pSVar8->prims;
    }
    sVar48 = children.numSharedPrimVecs;
    if (local_1a48 == pvVar38) {
      children.primvecs.items[children.numChildren] = pSVar8;
      sVar48 = pSVar8->refCount;
      pSVar8->refCount = sVar48 + 1;
    }
    else {
      pSVar23 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar24 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar24->prims = local_1a48;
      children.sharedPrimVecs.items[sVar48].refCount = 1;
      children.primvecs.items[children.numChildren] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar23->prims;
      sVar48 = pSVar8->refCount - 1;
    }
    pSVar8->refCount = sVar48;
    bi.lower = VVar26;
    if (sVar48 == 0) {
      pvVar38 = pSVar8->prims;
      if (pvVar38 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar48 = pvVar38->size_alloced;
        pPVar9 = pvVar38->items;
        if (pPVar9 != (PrimRefMB *)0x0) {
          if (sVar48 * 0x50 < 0x1c00000) {
            alignedFree(pPVar9);
          }
          else {
            os_free(pPVar9,sVar48 * 0x50,(pvVar38->alloc).hugepages);
          }
        }
        if (sVar48 != 0) {
          pMVar10 = (pvVar38->alloc).device;
          (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar48 * -0x50,1);
        }
        pvVar38->size_active = 0;
        pvVar38->size_alloced = 0;
        pvVar38->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar38);
    }
    local_1e48._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    BuildRecordSplit::operator=
              ((BuildRecordSplit *)&children.children.items[sVar34].super_BuildRecord,
               (BuildRecordSplit *)&v2);
    BuildRecordSplit::operator=
              ((BuildRecordSplit *)&children.children.items[children.numChildren].super_BuildRecord,
               (BuildRecordSplit *)&geomID);
    bVar29 = bVar29 | bVar60;
    children.numChildren = children.numChildren + 1;
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                   *)&local_1e48);
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr(&new_vector);
  } while (children.numChildren < (this->cfg).branchingFactor);
  pfVar39 = &children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  sVar34 = children.numChildren;
  while (bVar60 = sVar34 != 0, sVar34 = sVar34 - 1, bVar60) {
    auVar63 = vcmpps_avx(ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.lower),
                         ZEXT416((uint)((BBox1f *)(pfVar39 + -1))->lower),1);
    auVar64 = vcmpps_avx(ZEXT416((uint)*pfVar39),
                         ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.upper),1);
    auVar63 = vorps_avx(auVar63,auVar64);
    bVar29 = bVar29 | auVar63[0];
    pfVar39 = pfVar39 + 0x3c;
  }
  if ((bVar29 & 1) == 0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0x1c0;
    pTVar13 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar13->alloc)._M_b._M_p) {
      geomID.field_0.v[1]._0_1_ = 1;
      geomID.field_0.v[0] = (longlong)pTVar13;
      MutexSys::lock(&pTVar13->mutex);
      if ((pTVar13->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar13->alloc1).bytesUsed + (pTVar13->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar13->alloc0).end + (pTVar13->alloc1).end) -
             ((pTVar13->alloc0).cur + (pTVar13->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar13->alloc1).bytesWasted + (pTVar13->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar69 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar13->alloc0).end = auVar69._0_8_;
      (pTVar13->alloc0).allocBlockSize = auVar69._8_8_;
      (pTVar13->alloc0).bytesUsed = auVar69._16_8_;
      (pTVar13->alloc0).bytesWasted = auVar69._24_8_;
      (pTVar13->alloc0).ptr = (char *)auVar69._0_8_;
      (pTVar13->alloc0).cur = auVar69._8_8_;
      (pTVar13->alloc0).end = auVar69._16_8_;
      (pTVar13->alloc0).allocBlockSize = auVar69._24_8_;
      auVar69 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar13->alloc1).end = auVar69._0_8_;
        (pTVar13->alloc1).allocBlockSize = auVar69._8_8_;
        (pTVar13->alloc1).bytesUsed = auVar69._16_8_;
        (pTVar13->alloc1).bytesWasted = auVar69._24_8_;
        (pTVar13->alloc1).ptr = (char *)auVar69._0_8_;
        (pTVar13->alloc1).cur = auVar69._8_8_;
        (pTVar13->alloc1).end = auVar69._16_8_;
        (pTVar13->alloc1).allocBlockSize = auVar69._24_8_;
      }
      else {
        (pTVar13->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar13->alloc1).ptr = (char *)auVar69._0_8_;
        (pTVar13->alloc1).cur = auVar69._8_8_;
        (pTVar13->alloc1).end = auVar69._16_8_;
        (pTVar13->alloc1).allocBlockSize = auVar69._24_8_;
        (pTVar13->alloc1).end = auVar69._0_8_;
        (pTVar13->alloc1).allocBlockSize = auVar69._8_8_;
        (pTVar13->alloc1).bytesUsed = auVar69._16_8_;
        (pTVar13->alloc1).bytesWasted = auVar69._24_8_;
        (pTVar13->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar13->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      bi.lower.field_0._0_8_ = pTVar13;
      v2.field_0.v[1]._0_1_ = 1;
      v2.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&bi);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v2);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&geomID);
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar34 = (alloc.talloc0)->cur;
    uVar55 = (ulong)(-(int)sVar34 & 0x1f);
    uVar51 = sVar34 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar55;
    (alloc.talloc0)->cur = uVar51;
    if ((alloc.talloc0)->end < uVar51) {
      (alloc.talloc0)->cur = sVar34;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar45 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar45 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
        (alloc.talloc0)->ptr = pcVar45;
        sVar34 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar34;
        (alloc.talloc0)->end = v2.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v2.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
          pcVar45 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
          (alloc.talloc0)->ptr = pcVar45;
          sVar34 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar34;
          (alloc.talloc0)->end = v2.field_0.v[0];
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)v2.field_0.v[0] <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar45 = (char *)0x0;
            goto LAB_00cb2d6a;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar34;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar55;
      pcVar45 = (alloc.talloc0)->ptr +
                (uVar51 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_00cb2d6a:
    pcVar45[0xc0] = '\0';
    pcVar45[0xc1] = '\0';
    pcVar45[0xc2] = -0x80;
    pcVar45[0xc3] = '\x7f';
    pcVar45[0xc4] = '\0';
    pcVar45[0xc5] = '\0';
    pcVar45[0xc6] = -0x80;
    pcVar45[199] = '\x7f';
    pcVar45[200] = '\0';
    pcVar45[0xc9] = '\0';
    pcVar45[0xca] = -0x80;
    pcVar45[0xcb] = '\x7f';
    pcVar45[0xcc] = '\0';
    pcVar45[0xcd] = '\0';
    pcVar45[0xce] = -0x80;
    pcVar45[0xcf] = '\x7f';
    pcVar45[0xd0] = '\0';
    pcVar45[0xd1] = '\0';
    pcVar45[0xd2] = -0x80;
    pcVar45[0xd3] = '\x7f';
    pcVar45[0xd4] = '\0';
    pcVar45[0xd5] = '\0';
    pcVar45[0xd6] = -0x80;
    pcVar45[0xd7] = '\x7f';
    pcVar45[0xd8] = '\0';
    pcVar45[0xd9] = '\0';
    pcVar45[0xda] = -0x80;
    pcVar45[0xdb] = '\x7f';
    pcVar45[0xdc] = '\0';
    pcVar45[0xdd] = '\0';
    pcVar45[0xde] = -0x80;
    pcVar45[0xdf] = '\x7f';
    pcVar45[0x80] = '\0';
    pcVar45[0x81] = '\0';
    pcVar45[0x82] = -0x80;
    pcVar45[0x83] = '\x7f';
    pcVar45[0x84] = '\0';
    pcVar45[0x85] = '\0';
    pcVar45[0x86] = -0x80;
    pcVar45[0x87] = '\x7f';
    pcVar45[0x88] = '\0';
    pcVar45[0x89] = '\0';
    pcVar45[0x8a] = -0x80;
    pcVar45[0x8b] = '\x7f';
    pcVar45[0x8c] = '\0';
    pcVar45[0x8d] = '\0';
    pcVar45[0x8e] = -0x80;
    pcVar45[0x8f] = '\x7f';
    pcVar45[0x90] = '\0';
    pcVar45[0x91] = '\0';
    pcVar45[0x92] = -0x80;
    pcVar45[0x93] = '\x7f';
    pcVar45[0x94] = '\0';
    pcVar45[0x95] = '\0';
    pcVar45[0x96] = -0x80;
    pcVar45[0x97] = '\x7f';
    pcVar45[0x98] = '\0';
    pcVar45[0x99] = '\0';
    pcVar45[0x9a] = -0x80;
    pcVar45[0x9b] = '\x7f';
    pcVar45[0x9c] = '\0';
    pcVar45[0x9d] = '\0';
    pcVar45[0x9e] = -0x80;
    pcVar45[0x9f] = '\x7f';
    pcVar45[0x40] = '\0';
    pcVar45[0x41] = '\0';
    pcVar45[0x42] = -0x80;
    pcVar45[0x43] = '\x7f';
    pcVar45[0x44] = '\0';
    pcVar45[0x45] = '\0';
    pcVar45[0x46] = -0x80;
    pcVar45[0x47] = '\x7f';
    pcVar45[0x48] = '\0';
    pcVar45[0x49] = '\0';
    pcVar45[0x4a] = -0x80;
    pcVar45[0x4b] = '\x7f';
    pcVar45[0x4c] = '\0';
    pcVar45[0x4d] = '\0';
    pcVar45[0x4e] = -0x80;
    pcVar45[0x4f] = '\x7f';
    pcVar45[0x50] = '\0';
    pcVar45[0x51] = '\0';
    pcVar45[0x52] = -0x80;
    pcVar45[0x53] = '\x7f';
    pcVar45[0x54] = '\0';
    pcVar45[0x55] = '\0';
    pcVar45[0x56] = -0x80;
    pcVar45[0x57] = '\x7f';
    pcVar45[0x58] = '\0';
    pcVar45[0x59] = '\0';
    pcVar45[0x5a] = -0x80;
    pcVar45[0x5b] = '\x7f';
    pcVar45[0x5c] = '\0';
    pcVar45[0x5d] = '\0';
    pcVar45[0x5e] = -0x80;
    pcVar45[0x5f] = '\x7f';
    pcVar45[0xe0] = '\0';
    pcVar45[0xe1] = '\0';
    pcVar45[0xe2] = -0x80;
    pcVar45[0xe3] = -1;
    pcVar45[0xe4] = '\0';
    pcVar45[0xe5] = '\0';
    pcVar45[0xe6] = -0x80;
    pcVar45[0xe7] = -1;
    pcVar45[0xe8] = '\0';
    pcVar45[0xe9] = '\0';
    pcVar45[0xea] = -0x80;
    pcVar45[0xeb] = -1;
    pcVar45[0xec] = '\0';
    pcVar45[0xed] = '\0';
    pcVar45[0xee] = -0x80;
    pcVar45[0xef] = -1;
    pcVar45[0xf0] = '\0';
    pcVar45[0xf1] = '\0';
    pcVar45[0xf2] = -0x80;
    pcVar45[0xf3] = -1;
    pcVar45[0xf4] = '\0';
    pcVar45[0xf5] = '\0';
    pcVar45[0xf6] = -0x80;
    pcVar45[0xf7] = -1;
    pcVar45[0xf8] = '\0';
    pcVar45[0xf9] = '\0';
    pcVar45[0xfa] = -0x80;
    pcVar45[0xfb] = -1;
    pcVar45[0xfc] = '\0';
    pcVar45[0xfd] = '\0';
    pcVar45[0xfe] = -0x80;
    pcVar45[0xff] = -1;
    pcVar45[0xa0] = '\0';
    pcVar45[0xa1] = '\0';
    pcVar45[0xa2] = -0x80;
    pcVar45[0xa3] = -1;
    pcVar45[0xa4] = '\0';
    pcVar45[0xa5] = '\0';
    pcVar45[0xa6] = -0x80;
    pcVar45[0xa7] = -1;
    pcVar45[0xa8] = '\0';
    pcVar45[0xa9] = '\0';
    pcVar45[0xaa] = -0x80;
    pcVar45[0xab] = -1;
    pcVar45[0xac] = '\0';
    pcVar45[0xad] = '\0';
    pcVar45[0xae] = -0x80;
    pcVar45[0xaf] = -1;
    pcVar45[0xb0] = '\0';
    pcVar45[0xb1] = '\0';
    pcVar45[0xb2] = -0x80;
    pcVar45[0xb3] = -1;
    pcVar45[0xb4] = '\0';
    pcVar45[0xb5] = '\0';
    pcVar45[0xb6] = -0x80;
    pcVar45[0xb7] = -1;
    pcVar45[0xb8] = '\0';
    pcVar45[0xb9] = '\0';
    pcVar45[0xba] = -0x80;
    pcVar45[0xbb] = -1;
    pcVar45[0xbc] = '\0';
    pcVar45[0xbd] = '\0';
    pcVar45[0xbe] = -0x80;
    pcVar45[0xbf] = -1;
    pcVar45[0x60] = '\0';
    pcVar45[0x61] = '\0';
    pcVar45[0x62] = -0x80;
    pcVar45[99] = -1;
    pcVar45[100] = '\0';
    pcVar45[0x65] = '\0';
    pcVar45[0x66] = -0x80;
    pcVar45[0x67] = -1;
    pcVar45[0x68] = '\0';
    pcVar45[0x69] = '\0';
    pcVar45[0x6a] = -0x80;
    pcVar45[0x6b] = -1;
    pcVar45[0x6c] = '\0';
    pcVar45[0x6d] = '\0';
    pcVar45[0x6e] = -0x80;
    pcVar45[0x6f] = -1;
    pcVar45[0x70] = '\0';
    pcVar45[0x71] = '\0';
    pcVar45[0x72] = -0x80;
    pcVar45[0x73] = -1;
    pcVar45[0x74] = '\0';
    pcVar45[0x75] = '\0';
    pcVar45[0x76] = -0x80;
    pcVar45[0x77] = -1;
    pcVar45[0x78] = '\0';
    pcVar45[0x79] = '\0';
    pcVar45[0x7a] = -0x80;
    pcVar45[0x7b] = -1;
    pcVar45[0x7c] = '\0';
    pcVar45[0x7d] = '\0';
    pcVar45[0x7e] = -0x80;
    pcVar45[0x7f] = -1;
    auVar69 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar45 + 0x100) = auVar69;
    *(undefined1 (*) [32])(pcVar45 + 0x120) = auVar69;
    auVar69 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar45 + 0x140) = auVar69;
    *(undefined1 (*) [32])(pcVar45 + 0x160) = auVar69;
    *(undefined1 (*) [32])(pcVar45 + 0x180) = auVar69;
    *(undefined1 (*) [32])(pcVar45 + 0x1a0) = auVar69;
    for (lVar35 = 0; lVar35 != 8; lVar35 = lVar35 + 1) {
      pcVar3 = pcVar45 + lVar35 * 8;
      pcVar3[0] = '\b';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
    }
    goto LAB_00cb2def;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x200;
  pTVar13 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar13->alloc)._M_b._M_p) {
    geomID.field_0.v[1]._0_1_ = 1;
    geomID.field_0.v[0] = (longlong)pTVar13;
    MutexSys::lock(&pTVar13->mutex);
    if ((pTVar13->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar13->alloc1).bytesUsed + (pTVar13->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar13->alloc0).end + (pTVar13->alloc1).end) -
           ((pTVar13->alloc0).cur + (pTVar13->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar13->alloc1).bytesWasted + (pTVar13->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar69 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar13->alloc0).end = auVar69._0_8_;
    (pTVar13->alloc0).allocBlockSize = auVar69._8_8_;
    (pTVar13->alloc0).bytesUsed = auVar69._16_8_;
    (pTVar13->alloc0).bytesWasted = auVar69._24_8_;
    (pTVar13->alloc0).ptr = (char *)auVar69._0_8_;
    (pTVar13->alloc0).cur = auVar69._8_8_;
    (pTVar13->alloc0).end = auVar69._16_8_;
    (pTVar13->alloc0).allocBlockSize = auVar69._24_8_;
    auVar69 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar13->alloc1).end = auVar69._0_8_;
      (pTVar13->alloc1).allocBlockSize = auVar69._8_8_;
      (pTVar13->alloc1).bytesUsed = auVar69._16_8_;
      (pTVar13->alloc1).bytesWasted = auVar69._24_8_;
      (pTVar13->alloc1).ptr = (char *)auVar69._0_8_;
      (pTVar13->alloc1).cur = auVar69._8_8_;
      (pTVar13->alloc1).end = auVar69._16_8_;
      (pTVar13->alloc1).allocBlockSize = auVar69._24_8_;
    }
    else {
      (pTVar13->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar13->alloc1).ptr = (char *)auVar69._0_8_;
      (pTVar13->alloc1).cur = auVar69._8_8_;
      (pTVar13->alloc1).end = auVar69._16_8_;
      (pTVar13->alloc1).allocBlockSize = auVar69._24_8_;
      (pTVar13->alloc1).end = auVar69._0_8_;
      (pTVar13->alloc1).allocBlockSize = auVar69._8_8_;
      (pTVar13->alloc1).bytesUsed = auVar69._16_8_;
      (pTVar13->alloc1).bytesWasted = auVar69._24_8_;
      (pTVar13->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar13->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    bi.lower.field_0._0_8_ = pTVar13;
    v2.field_0.v[1]._0_1_ = 1;
    v2.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&bi);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v2);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&geomID);
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar34 = (alloc.talloc0)->cur;
  uVar55 = (ulong)(-(int)sVar34 & 0x1f);
  uVar51 = sVar34 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar55;
  (alloc.talloc0)->cur = uVar51;
  if ((alloc.talloc0)->end < uVar51) {
    (alloc.talloc0)->cur = sVar34;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar45 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
      pcVar45 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
      (alloc.talloc0)->ptr = pcVar45;
      sVar34 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar34;
      (alloc.talloc0)->end = v2.field_0.v[0];
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)v2.field_0.v[0] <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar45 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
        (alloc.talloc0)->ptr = pcVar45;
        sVar34 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar34;
        (alloc.talloc0)->end = v2.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v2.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar45 = (char *)0x0;
          goto LAB_00cb2c26;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar34;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar55;
    pcVar45 = (alloc.talloc0)->ptr +
              (uVar51 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_00cb2c26:
  pcVar45[0x1c0] = '\0';
  pcVar45[0x1c1] = '\0';
  pcVar45[0x1c2] = -0x80;
  pcVar45[0x1c3] = '\x7f';
  pcVar45[0x1c4] = '\0';
  pcVar45[0x1c5] = '\0';
  pcVar45[0x1c6] = -0x80;
  pcVar45[0x1c7] = '\x7f';
  pcVar45[0x1c8] = '\0';
  pcVar45[0x1c9] = '\0';
  pcVar45[0x1ca] = -0x80;
  pcVar45[0x1cb] = '\x7f';
  pcVar45[0x1cc] = '\0';
  pcVar45[0x1cd] = '\0';
  pcVar45[0x1ce] = -0x80;
  pcVar45[0x1cf] = '\x7f';
  pcVar45[0x1d0] = '\0';
  pcVar45[0x1d1] = '\0';
  pcVar45[0x1d2] = -0x80;
  pcVar45[0x1d3] = '\x7f';
  pcVar45[0x1d4] = '\0';
  pcVar45[0x1d5] = '\0';
  pcVar45[0x1d6] = -0x80;
  pcVar45[0x1d7] = '\x7f';
  pcVar45[0x1d8] = '\0';
  pcVar45[0x1d9] = '\0';
  pcVar45[0x1da] = -0x80;
  pcVar45[0x1db] = '\x7f';
  pcVar45[0x1dc] = '\0';
  pcVar45[0x1dd] = '\0';
  pcVar45[0x1de] = -0x80;
  pcVar45[0x1df] = '\x7f';
  pcVar45[0x1e0] = '\0';
  pcVar45[0x1e1] = '\0';
  pcVar45[0x1e2] = -0x80;
  pcVar45[0x1e3] = -1;
  pcVar45[0x1e4] = '\0';
  pcVar45[0x1e5] = '\0';
  pcVar45[0x1e6] = -0x80;
  pcVar45[0x1e7] = -1;
  pcVar45[0x1e8] = '\0';
  pcVar45[0x1e9] = '\0';
  pcVar45[0x1ea] = -0x80;
  pcVar45[0x1eb] = -1;
  pcVar45[0x1ec] = '\0';
  pcVar45[0x1ed] = '\0';
  pcVar45[0x1ee] = -0x80;
  pcVar45[0x1ef] = -1;
  pcVar45[0x1f0] = '\0';
  pcVar45[0x1f1] = '\0';
  pcVar45[0x1f2] = -0x80;
  pcVar45[499] = -1;
  pcVar45[500] = '\0';
  pcVar45[0x1f5] = '\0';
  pcVar45[0x1f6] = -0x80;
  pcVar45[0x1f7] = -1;
  pcVar45[0x1f8] = '\0';
  pcVar45[0x1f9] = '\0';
  pcVar45[0x1fa] = -0x80;
  pcVar45[0x1fb] = -1;
  pcVar45[0x1fc] = '\0';
  pcVar45[0x1fd] = '\0';
  pcVar45[0x1fe] = -0x80;
  pcVar45[0x1ff] = -1;
  pcVar45[0xc0] = '\0';
  pcVar45[0xc1] = '\0';
  pcVar45[0xc2] = -0x80;
  pcVar45[0xc3] = '\x7f';
  pcVar45[0xc4] = '\0';
  pcVar45[0xc5] = '\0';
  pcVar45[0xc6] = -0x80;
  pcVar45[199] = '\x7f';
  pcVar45[200] = '\0';
  pcVar45[0xc9] = '\0';
  pcVar45[0xca] = -0x80;
  pcVar45[0xcb] = '\x7f';
  pcVar45[0xcc] = '\0';
  pcVar45[0xcd] = '\0';
  pcVar45[0xce] = -0x80;
  pcVar45[0xcf] = '\x7f';
  pcVar45[0xd0] = '\0';
  pcVar45[0xd1] = '\0';
  pcVar45[0xd2] = -0x80;
  pcVar45[0xd3] = '\x7f';
  pcVar45[0xd4] = '\0';
  pcVar45[0xd5] = '\0';
  pcVar45[0xd6] = -0x80;
  pcVar45[0xd7] = '\x7f';
  pcVar45[0xd8] = '\0';
  pcVar45[0xd9] = '\0';
  pcVar45[0xda] = -0x80;
  pcVar45[0xdb] = '\x7f';
  pcVar45[0xdc] = '\0';
  pcVar45[0xdd] = '\0';
  pcVar45[0xde] = -0x80;
  pcVar45[0xdf] = '\x7f';
  pcVar45[0x80] = '\0';
  pcVar45[0x81] = '\0';
  pcVar45[0x82] = -0x80;
  pcVar45[0x83] = '\x7f';
  pcVar45[0x84] = '\0';
  pcVar45[0x85] = '\0';
  pcVar45[0x86] = -0x80;
  pcVar45[0x87] = '\x7f';
  pcVar45[0x88] = '\0';
  pcVar45[0x89] = '\0';
  pcVar45[0x8a] = -0x80;
  pcVar45[0x8b] = '\x7f';
  pcVar45[0x8c] = '\0';
  pcVar45[0x8d] = '\0';
  pcVar45[0x8e] = -0x80;
  pcVar45[0x8f] = '\x7f';
  pcVar45[0x90] = '\0';
  pcVar45[0x91] = '\0';
  pcVar45[0x92] = -0x80;
  pcVar45[0x93] = '\x7f';
  pcVar45[0x94] = '\0';
  pcVar45[0x95] = '\0';
  pcVar45[0x96] = -0x80;
  pcVar45[0x97] = '\x7f';
  pcVar45[0x98] = '\0';
  pcVar45[0x99] = '\0';
  pcVar45[0x9a] = -0x80;
  pcVar45[0x9b] = '\x7f';
  pcVar45[0x9c] = '\0';
  pcVar45[0x9d] = '\0';
  pcVar45[0x9e] = -0x80;
  pcVar45[0x9f] = '\x7f';
  pcVar45[0x40] = '\0';
  pcVar45[0x41] = '\0';
  pcVar45[0x42] = -0x80;
  pcVar45[0x43] = '\x7f';
  pcVar45[0x44] = '\0';
  pcVar45[0x45] = '\0';
  pcVar45[0x46] = -0x80;
  pcVar45[0x47] = '\x7f';
  pcVar45[0x48] = '\0';
  pcVar45[0x49] = '\0';
  pcVar45[0x4a] = -0x80;
  pcVar45[0x4b] = '\x7f';
  pcVar45[0x4c] = '\0';
  pcVar45[0x4d] = '\0';
  pcVar45[0x4e] = -0x80;
  pcVar45[0x4f] = '\x7f';
  pcVar45[0x50] = '\0';
  pcVar45[0x51] = '\0';
  pcVar45[0x52] = -0x80;
  pcVar45[0x53] = '\x7f';
  pcVar45[0x54] = '\0';
  pcVar45[0x55] = '\0';
  pcVar45[0x56] = -0x80;
  pcVar45[0x57] = '\x7f';
  pcVar45[0x58] = '\0';
  pcVar45[0x59] = '\0';
  pcVar45[0x5a] = -0x80;
  pcVar45[0x5b] = '\x7f';
  pcVar45[0x5c] = '\0';
  pcVar45[0x5d] = '\0';
  pcVar45[0x5e] = -0x80;
  pcVar45[0x5f] = '\x7f';
  pcVar45[0xe0] = '\0';
  pcVar45[0xe1] = '\0';
  pcVar45[0xe2] = -0x80;
  pcVar45[0xe3] = -1;
  pcVar45[0xe4] = '\0';
  pcVar45[0xe5] = '\0';
  pcVar45[0xe6] = -0x80;
  pcVar45[0xe7] = -1;
  pcVar45[0xe8] = '\0';
  pcVar45[0xe9] = '\0';
  pcVar45[0xea] = -0x80;
  pcVar45[0xeb] = -1;
  pcVar45[0xec] = '\0';
  pcVar45[0xed] = '\0';
  pcVar45[0xee] = -0x80;
  pcVar45[0xef] = -1;
  pcVar45[0xf0] = '\0';
  pcVar45[0xf1] = '\0';
  pcVar45[0xf2] = -0x80;
  pcVar45[0xf3] = -1;
  pcVar45[0xf4] = '\0';
  pcVar45[0xf5] = '\0';
  pcVar45[0xf6] = -0x80;
  pcVar45[0xf7] = -1;
  pcVar45[0xf8] = '\0';
  pcVar45[0xf9] = '\0';
  pcVar45[0xfa] = -0x80;
  pcVar45[0xfb] = -1;
  pcVar45[0xfc] = '\0';
  pcVar45[0xfd] = '\0';
  pcVar45[0xfe] = -0x80;
  pcVar45[0xff] = -1;
  pcVar45[0xa0] = '\0';
  pcVar45[0xa1] = '\0';
  pcVar45[0xa2] = -0x80;
  pcVar45[0xa3] = -1;
  pcVar45[0xa4] = '\0';
  pcVar45[0xa5] = '\0';
  pcVar45[0xa6] = -0x80;
  pcVar45[0xa7] = -1;
  pcVar45[0xa8] = '\0';
  pcVar45[0xa9] = '\0';
  pcVar45[0xaa] = -0x80;
  pcVar45[0xab] = -1;
  pcVar45[0xac] = '\0';
  pcVar45[0xad] = '\0';
  pcVar45[0xae] = -0x80;
  pcVar45[0xaf] = -1;
  pcVar45[0xb0] = '\0';
  pcVar45[0xb1] = '\0';
  pcVar45[0xb2] = -0x80;
  pcVar45[0xb3] = -1;
  pcVar45[0xb4] = '\0';
  pcVar45[0xb5] = '\0';
  pcVar45[0xb6] = -0x80;
  pcVar45[0xb7] = -1;
  pcVar45[0xb8] = '\0';
  pcVar45[0xb9] = '\0';
  pcVar45[0xba] = -0x80;
  pcVar45[0xbb] = -1;
  pcVar45[0xbc] = '\0';
  pcVar45[0xbd] = '\0';
  pcVar45[0xbe] = -0x80;
  pcVar45[0xbf] = -1;
  pcVar45[0x60] = '\0';
  pcVar45[0x61] = '\0';
  pcVar45[0x62] = -0x80;
  pcVar45[99] = -1;
  pcVar45[100] = '\0';
  pcVar45[0x65] = '\0';
  pcVar45[0x66] = -0x80;
  pcVar45[0x67] = -1;
  pcVar45[0x68] = '\0';
  pcVar45[0x69] = '\0';
  pcVar45[0x6a] = -0x80;
  pcVar45[0x6b] = -1;
  pcVar45[0x6c] = '\0';
  pcVar45[0x6d] = '\0';
  pcVar45[0x6e] = -0x80;
  pcVar45[0x6f] = -1;
  pcVar45[0x70] = '\0';
  pcVar45[0x71] = '\0';
  pcVar45[0x72] = -0x80;
  pcVar45[0x73] = -1;
  pcVar45[0x74] = '\0';
  pcVar45[0x75] = '\0';
  pcVar45[0x76] = -0x80;
  pcVar45[0x77] = -1;
  pcVar45[0x78] = '\0';
  pcVar45[0x79] = '\0';
  pcVar45[0x7a] = -0x80;
  pcVar45[0x7b] = -1;
  pcVar45[0x7c] = '\0';
  pcVar45[0x7d] = '\0';
  pcVar45[0x7e] = -0x80;
  pcVar45[0x7f] = -1;
  auVar69 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar45 + 0x100) = auVar69;
  *(undefined1 (*) [32])(pcVar45 + 0x120) = auVar69;
  auVar69 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar45 + 0x140) = auVar69;
  *(undefined1 (*) [32])(pcVar45 + 0x160) = auVar69;
  *(undefined1 (*) [32])(pcVar45 + 0x180) = auVar69;
  *(undefined1 (*) [32])(pcVar45 + 0x1a0) = auVar69;
  local_1ec8 = 6;
  for (lVar35 = 0; lVar35 != 8; lVar35 = lVar35 + 1) {
    pcVar3 = pcVar45 + lVar35 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
  }
LAB_00cb2def:
  local_1ec8 = local_1ec8 | (ulong)pcVar45;
  pBVar59 = &values[0].dt;
  local_1ee8._8_4_ = 0xff800000;
  local_1ee8._0_8_ = 0xff800000ff800000;
  local_1ee8._12_4_ = 0xff800000;
  uStack_1ef0._0_4_ = 0x7f800000;
  local_1ef8._0_8_ =
       (tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        )(_Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )0x7f8000007f800000;
  uStack_1ef0._4_4_ = 0x7f800000;
  in_00 = local_1e38;
  for (uVar55 = 0; local_1e38 = in_00, uVar55 < children.numChildren; uVar55 = uVar55 + 1) {
    createLargeLeaf((NodeRecordMB4D *)&v2,this,(BuildRecord *)in_00,alloc);
    vVar27 = v2;
    pBVar59[-10].lower = (float)v2.field_0.v[0]._0_4_;
    pBVar59[-10].upper = (float)v2.field_0._4_4_;
    auVar21._4_4_ = local_1c68.m128[1];
    auVar21._0_4_ = local_1c68.m128[0];
    auVar21._8_4_ = local_1c68.m128[2];
    auVar21._12_4_ = local_1c68.m128[3];
    *(undefined1 (*) [16])(pBVar59 + -8) = auVar21;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar59 + -6) = local_1c58;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar59 + -4) = local_1c48;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar59 + -2) = local_1c38;
    pBVar59->lower = (float)local_1c28[0]._0_4_;
    pBVar59->upper = (float)local_1c28[0]._4_4_;
    local_1ef8 = vminps_avx(local_1ef8,auVar21);
    local_1ee8 = vmaxps_avx(local_1ee8,(undefined1  [16])local_1c58);
    local_1e78 = vminps_avx(local_1e78,(undefined1  [16])local_1c48);
    local_1eb8 = vmaxps_avx(local_1eb8,(undefined1  [16])local_1c38);
    in_00 = (LocalChildListSplit *)((in_00->children).items + 1);
    pBVar59 = pBVar59 + 0xc;
    v2 = vVar27;
  }
  uVar55 = (ulong)pcVar45 & 0xfffffffffffffff0;
  if (((uint)local_1ec8 & 0xf) == 1) {
    pfVar39 = &values[0].dt.upper;
    auVar73._8_4_ = 0x7f7fffff;
    auVar73._0_8_ = 0x7f7fffff7f7fffff;
    auVar73._12_4_ = 0x7f7fffff;
    auVar77._8_4_ = 0xff7fffff;
    auVar77._0_8_ = 0xff7fffffff7fffff;
    auVar77._12_4_ = 0xff7fffff;
    auVar80._8_4_ = 0x7fffffff;
    auVar80._0_8_ = 0x7fffffff7fffffff;
    auVar80._12_4_ = 0x7fffffff;
    for (sVar34 = 0; children.numChildren != sVar34; sVar34 = sVar34 + 1) {
      *(undefined8 *)(uVar55 + sVar34 * 8) = *(undefined8 *)(pfVar39 + -0x15);
      fVar4 = ((BBox1f *)(pfVar39 + -1))->lower;
      fVar85 = 1.0 / (*pfVar39 - fVar4);
      fVar16 = -fVar4 * fVar85;
      auVar63 = vshufps_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16),0);
      auVar64 = vshufps_avx(ZEXT416((uint)(1.0 - fVar16)),ZEXT416((uint)(1.0 - fVar16)),0);
      auVar114._0_4_ = pfVar39[-9] * auVar63._0_4_ + pfVar39[-0x11] * auVar64._0_4_;
      auVar114._4_4_ = pfVar39[-8] * auVar63._4_4_ + pfVar39[-0x10] * auVar64._4_4_;
      auVar114._8_4_ = pfVar39[-7] * auVar63._8_4_ + pfVar39[-0xf] * auVar64._8_4_;
      auVar114._12_4_ = pfVar39[-6] * auVar63._12_4_ + pfVar39[-0xe] * auVar64._12_4_;
      auVar97._0_4_ = pfVar39[-5] * auVar63._0_4_ + pfVar39[-0xd] * auVar64._0_4_;
      auVar97._4_4_ = pfVar39[-4] * auVar63._4_4_ + pfVar39[-0xc] * auVar64._4_4_;
      auVar97._8_4_ = pfVar39[-3] * auVar63._8_4_ + pfVar39[-0xb] * auVar64._8_4_;
      auVar97._12_4_ = pfVar39[-2] * auVar63._12_4_ + pfVar39[-10] * auVar64._12_4_;
      fVar85 = (1.0 - fVar4) * fVar85;
      auVar63 = vshufps_avx(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85),0);
      auVar64 = vshufps_avx(ZEXT416((uint)(1.0 - fVar85)),ZEXT416((uint)(1.0 - fVar85)),0);
      auVar100._0_4_ = pfVar39[-9] * auVar63._0_4_ + pfVar39[-0x11] * auVar64._0_4_;
      auVar100._4_4_ = pfVar39[-8] * auVar63._4_4_ + pfVar39[-0x10] * auVar64._4_4_;
      auVar100._8_4_ = pfVar39[-7] * auVar63._8_4_ + pfVar39[-0xf] * auVar64._8_4_;
      auVar100._12_4_ = pfVar39[-6] * auVar63._12_4_ + pfVar39[-0xe] * auVar64._12_4_;
      auVar86._0_4_ = pfVar39[-5] * auVar63._0_4_ + pfVar39[-0xd] * auVar64._0_4_;
      auVar86._4_4_ = pfVar39[-4] * auVar63._4_4_ + pfVar39[-0xc] * auVar64._4_4_;
      auVar86._8_4_ = pfVar39[-3] * auVar63._8_4_ + pfVar39[-0xb] * auVar64._8_4_;
      auVar86._12_4_ = pfVar39[-2] * auVar63._12_4_ + pfVar39[-10] * auVar64._12_4_;
      auVar67 = vminps_avx(auVar114,auVar73);
      auVar64 = vmaxps_avx(auVar97,auVar77);
      auVar75 = vminps_avx(auVar100,auVar73);
      auVar76 = vmaxps_avx(auVar86,auVar77);
      auVar63 = vandps_avx(auVar67,auVar80);
      auVar107._0_4_ = auVar63._0_4_ * 4.7683716e-07;
      auVar107._4_4_ = auVar63._4_4_ * 4.7683716e-07;
      auVar107._8_4_ = auVar63._8_4_ * 4.7683716e-07;
      auVar107._12_4_ = auVar63._12_4_ * 4.7683716e-07;
      auVar67 = vsubps_avx(auVar67,auVar107);
      auVar63 = vandps_avx(auVar64,auVar80);
      auVar98._0_4_ = auVar64._0_4_ + auVar63._0_4_ * 4.7683716e-07;
      auVar98._4_4_ = auVar64._4_4_ + auVar63._4_4_ * 4.7683716e-07;
      auVar98._8_4_ = auVar64._8_4_ + auVar63._8_4_ * 4.7683716e-07;
      auVar98._12_4_ = auVar64._12_4_ + auVar63._12_4_ * 4.7683716e-07;
      auVar63 = vandps_avx(auVar75,auVar80);
      auVar108._0_4_ = auVar63._0_4_ * 4.7683716e-07;
      auVar108._4_4_ = auVar63._4_4_ * 4.7683716e-07;
      auVar108._8_4_ = auVar63._8_4_ * 4.7683716e-07;
      auVar108._12_4_ = auVar63._12_4_ * 4.7683716e-07;
      auVar64 = vsubps_avx(auVar75,auVar108);
      auVar63 = vandps_avx(auVar76,auVar80);
      *(int *)(uVar55 + 0x40 + sVar34 * 4) = auVar67._0_4_;
      uVar5 = vextractps_avx(auVar67,1);
      *(undefined4 *)(uVar55 + 0x80 + sVar34 * 4) = uVar5;
      auVar87._0_4_ = auVar63._0_4_ * 4.7683716e-07 + auVar76._0_4_;
      auVar87._4_4_ = auVar63._4_4_ * 4.7683716e-07 + auVar76._4_4_;
      auVar87._8_4_ = auVar63._8_4_ * 4.7683716e-07 + auVar76._8_4_;
      auVar87._12_4_ = auVar63._12_4_ * 4.7683716e-07 + auVar76._12_4_;
      uVar5 = vextractps_avx(auVar67,2);
      *(undefined4 *)(uVar55 + 0xc0 + sVar34 * 4) = uVar5;
      *(float *)(uVar55 + 0x60 + sVar34 * 4) = auVar98._0_4_;
      uVar5 = vextractps_avx(auVar98,1);
      *(undefined4 *)(uVar55 + 0xa0 + sVar34 * 4) = uVar5;
      auVar63 = vsubps_avx(auVar64,auVar67);
      uVar5 = vextractps_avx(auVar98,2);
      *(undefined4 *)(uVar55 + 0xe0 + sVar34 * 4) = uVar5;
      *(int *)(uVar55 + 0x100 + sVar34 * 4) = auVar63._0_4_;
      uVar5 = vextractps_avx(auVar63,1);
      *(undefined4 *)(uVar55 + 0x140 + sVar34 * 4) = uVar5;
      auVar64 = vsubps_avx(auVar87,auVar98);
      uVar5 = vextractps_avx(auVar63,2);
      *(undefined4 *)(uVar55 + 0x180 + sVar34 * 4) = uVar5;
      *(int *)(uVar55 + 0x120 + sVar34 * 4) = auVar64._0_4_;
      uVar5 = vextractps_avx(auVar64,1);
      *(undefined4 *)(uVar55 + 0x160 + sVar34 * 4) = uVar5;
      uVar5 = vextractps_avx(auVar64,2);
      *(undefined4 *)(uVar55 + 0x1a0 + sVar34 * 4) = uVar5;
      pfVar39 = pfVar39 + 0x18;
    }
  }
  else {
    pfVar39 = &values[0].dt.upper;
    auVar74._8_4_ = 0x7f7fffff;
    auVar74._0_8_ = 0x7f7fffff7f7fffff;
    auVar74._12_4_ = 0x7f7fffff;
    auVar78._8_4_ = 0xff7fffff;
    auVar78._0_8_ = 0xff7fffffff7fffff;
    auVar78._12_4_ = 0xff7fffff;
    auVar81._8_4_ = 0x7fffffff;
    auVar81._0_8_ = 0x7fffffff7fffffff;
    auVar81._12_4_ = 0x7fffffff;
    auVar89._8_4_ = 0x3f800001;
    auVar89._0_8_ = 0x3f8000013f800001;
    auVar89._12_4_ = 0x3f800001;
    for (sVar34 = 0; children.numChildren != sVar34; sVar34 = sVar34 + 1) {
      *(undefined8 *)(uVar55 + sVar34 * 8) = *(undefined8 *)(pfVar39 + -0x15);
      fVar4 = *pfVar39;
      fVar16 = ((BBox1f *)(pfVar39 + -1))->lower;
      fVar99 = 1.0 / (fVar4 - fVar16);
      fVar85 = fVar99 * -fVar16;
      auVar63 = vshufps_avx(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85),0);
      auVar64 = vshufps_avx(ZEXT416((uint)(1.0 - fVar85)),ZEXT416((uint)(1.0 - fVar85)),0);
      auVar71._0_4_ = pfVar39[-9] * auVar63._0_4_ + pfVar39[-0x11] * auVar64._0_4_;
      auVar71._4_4_ = pfVar39[-8] * auVar63._4_4_ + pfVar39[-0x10] * auVar64._4_4_;
      auVar71._8_4_ = pfVar39[-7] * auVar63._8_4_ + pfVar39[-0xf] * auVar64._8_4_;
      auVar71._12_4_ = pfVar39[-6] * auVar63._12_4_ + pfVar39[-0xe] * auVar64._12_4_;
      auVar109._0_4_ = pfVar39[-5] * auVar63._0_4_ + pfVar39[-0xd] * auVar64._0_4_;
      auVar109._4_4_ = pfVar39[-4] * auVar63._4_4_ + pfVar39[-0xc] * auVar64._4_4_;
      auVar109._8_4_ = pfVar39[-3] * auVar63._8_4_ + pfVar39[-0xb] * auVar64._8_4_;
      auVar109._12_4_ = pfVar39[-2] * auVar63._12_4_ + pfVar39[-10] * auVar64._12_4_;
      fVar99 = (1.0 - fVar16) * fVar99;
      auVar63 = vshufps_avx(ZEXT416((uint)fVar99),ZEXT416((uint)fVar99),0);
      auVar64 = vshufps_avx(ZEXT416((uint)(1.0 - fVar99)),ZEXT416((uint)(1.0 - fVar99)),0);
      auVar111._0_4_ = pfVar39[-9] * auVar63._0_4_ + pfVar39[-0x11] * auVar64._0_4_;
      auVar111._4_4_ = pfVar39[-8] * auVar63._4_4_ + pfVar39[-0x10] * auVar64._4_4_;
      auVar111._8_4_ = pfVar39[-7] * auVar63._8_4_ + pfVar39[-0xf] * auVar64._8_4_;
      auVar111._12_4_ = pfVar39[-6] * auVar63._12_4_ + pfVar39[-0xe] * auVar64._12_4_;
      auVar102._0_4_ = pfVar39[-5] * auVar63._0_4_ + pfVar39[-0xd] * auVar64._0_4_;
      auVar102._4_4_ = pfVar39[-4] * auVar63._4_4_ + pfVar39[-0xc] * auVar64._4_4_;
      auVar102._8_4_ = pfVar39[-3] * auVar63._8_4_ + pfVar39[-0xb] * auVar64._8_4_;
      auVar102._12_4_ = pfVar39[-2] * auVar63._12_4_ + pfVar39[-10] * auVar64._12_4_;
      auVar67 = vminps_avx(auVar71,auVar74);
      auVar64 = vmaxps_avx(auVar109,auVar78);
      auVar75 = vminps_avx(auVar111,auVar74);
      auVar76 = vmaxps_avx(auVar102,auVar78);
      auVar63 = vandps_avx(auVar67,auVar81);
      auVar112._0_4_ = auVar63._0_4_ * 4.7683716e-07;
      auVar112._4_4_ = auVar63._4_4_ * 4.7683716e-07;
      auVar112._8_4_ = auVar63._8_4_ * 4.7683716e-07;
      auVar112._12_4_ = auVar63._12_4_ * 4.7683716e-07;
      auVar67 = vsubps_avx(auVar67,auVar112);
      auVar63 = vandps_avx(auVar64,auVar81);
      auVar110._0_4_ = auVar64._0_4_ + auVar63._0_4_ * 4.7683716e-07;
      auVar110._4_4_ = auVar64._4_4_ + auVar63._4_4_ * 4.7683716e-07;
      auVar110._8_4_ = auVar64._8_4_ + auVar63._8_4_ * 4.7683716e-07;
      auVar110._12_4_ = auVar64._12_4_ + auVar63._12_4_ * 4.7683716e-07;
      auVar63 = vandps_avx(auVar75,auVar81);
      auVar113._0_4_ = auVar63._0_4_ * 4.7683716e-07;
      auVar113._4_4_ = auVar63._4_4_ * 4.7683716e-07;
      auVar113._8_4_ = auVar63._8_4_ * 4.7683716e-07;
      auVar113._12_4_ = auVar63._12_4_ * 4.7683716e-07;
      auVar64 = vsubps_avx(auVar75,auVar113);
      auVar63 = vandps_avx(auVar76,auVar81);
      *(int *)(uVar55 + 0x40 + sVar34 * 4) = auVar67._0_4_;
      uVar5 = vextractps_avx(auVar67,1);
      *(undefined4 *)(uVar55 + 0x80 + sVar34 * 4) = uVar5;
      auVar103._0_4_ = auVar76._0_4_ + auVar63._0_4_ * 4.7683716e-07;
      auVar103._4_4_ = auVar76._4_4_ + auVar63._4_4_ * 4.7683716e-07;
      auVar103._8_4_ = auVar76._8_4_ + auVar63._8_4_ * 4.7683716e-07;
      auVar103._12_4_ = auVar76._12_4_ + auVar63._12_4_ * 4.7683716e-07;
      uVar5 = vextractps_avx(auVar67,2);
      *(undefined4 *)(uVar55 + 0xc0 + sVar34 * 4) = uVar5;
      *(float *)(uVar55 + 0x60 + sVar34 * 4) = auVar110._0_4_;
      uVar5 = vextractps_avx(auVar110,1);
      *(undefined4 *)(uVar55 + 0xa0 + sVar34 * 4) = uVar5;
      auVar63 = vsubps_avx(auVar64,auVar67);
      uVar5 = vextractps_avx(auVar110,2);
      *(undefined4 *)(uVar55 + 0xe0 + sVar34 * 4) = uVar5;
      *(int *)(uVar55 + 0x100 + sVar34 * 4) = auVar63._0_4_;
      uVar5 = vextractps_avx(auVar63,1);
      *(undefined4 *)(uVar55 + 0x140 + sVar34 * 4) = uVar5;
      auVar64 = vsubps_avx(auVar103,auVar110);
      uVar5 = vextractps_avx(auVar63,2);
      *(undefined4 *)(uVar55 + 0x180 + sVar34 * 4) = uVar5;
      *(int *)(uVar55 + 0x120 + sVar34 * 4) = auVar64._0_4_;
      uVar5 = vextractps_avx(auVar64,1);
      *(undefined4 *)(uVar55 + 0x160 + sVar34 * 4) = uVar5;
      uVar5 = vextractps_avx(auVar64,2);
      *(undefined4 *)(uVar55 + 0x1a0 + sVar34 * 4) = uVar5;
      auVar63 = vcmpss_avx(ZEXT416((uint)fVar4),SUB6416(ZEXT464(0x3f800000),0),0);
      auVar63 = vblendvps_avx(ZEXT416((uint)fVar4),auVar89,auVar63);
      *(float *)(uVar55 + 0x1c0 + sVar34 * 4) = fVar16;
      *(int *)(uVar55 + 0x1e0 + sVar34 * 4) = auVar63._0_4_;
      pfVar39 = pfVar39 + 0x18;
    }
  }
  if ((bVar29 & 1) == 0) {
    (__return_storage_ptr__->ref).ptr = local_1ec8;
    *(tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1ef8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         uStack_1ef0;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1ee8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1ee8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1e78._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1e78._8_8_;
  }
  else {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)&current.super_BuildRecord.prims;
    geomID.field_0.i[2] = 0x7f800000;
    geomID.field_0.v[0] = 0x7f8000007f800000;
    geomID.field_0.i[3] = 0x7f800000;
    local_1ad8.m128[0] = -INFINITY;
    local_1ad8.m128[1] = -INFINITY;
    local_1ad8.m128[2] = -INFINITY;
    local_1ad8.m128[3] = -INFINITY;
    local_1ac8.m128[0] = INFINITY;
    local_1ac8.m128[1] = INFINITY;
    local_1ac8.m128[2] = INFINITY;
    local_1ac8.m128[3] = INFINITY;
    local_1ab8[0].m128[0] = -INFINITY;
    local_1ab8[0].m128[1] = -INFINITY;
    local_1ab8[0].m128[2] = -INFINITY;
    local_1ab8[0].m128[3] = -INFINITY;
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end -
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin < 0xc00) {
      v2.field_0.v[1] = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      v2.field_0.v[0] = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&bi,(anon_class_16_2_aeee9775 *)&vSplitPos,(range<unsigned_long> *)&v2)
      ;
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&v2,(context_traits)0x4,CUSTOM_CTX);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&bi,(d1 *)&right,(blocked_range<unsigned_long> *)&geomID,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,(anon_class_1_0_00000001 *)&v2,
                 (task_group_context *)local_1ef8._0_8_);
      cVar30 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&v2);
      if (cVar30 != '\0') {
        prVar37 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar37,"task cancelled");
        __cxa_throw(prVar37,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&v2);
    }
    (__return_storage_ptr__->ref).ptr = local_1ec8;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = bi.lower.field_0._0_8_
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         bi.lower.field_0._8_8_;
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         CONCAT44(bi.upper.field_0.m128[1],bi.upper.field_0.m128[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         CONCAT44(bi.upper.field_0.m128[3],bi.upper.field_0.m128[2]);
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 =
         CONCAT44(local_1e08.i[1],local_1e08.i[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(local_1e08.i[3],local_1e08.i[2]);
    local_1eb8._0_8_ = CONCAT44(aaStack_1df8[0].i[1],aaStack_1df8[0].i[0]);
    local_1eb8._8_8_ = CONCAT44(aaStack_1df8[0].i[3],aaStack_1df8[0].i[2]);
    in_00 = local_1e38;
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1eb8._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1eb8._8_8_;
  BVar6.upper = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  BVar6.lower = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
  __return_storage_ptr__->dt = BVar6;
  for (uVar55 = 0; uVar55 < children.numChildren; uVar55 = uVar55 + 1) {
    pSVar8 = children.primvecs.items[uVar55];
    psVar1 = &pSVar8->refCount;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      pvVar38 = pSVar8->prims;
      if (pvVar38 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar34 = pvVar38->size_alloced;
        pPVar9 = pvVar38->items;
        local_1e38 = in_00;
        if (pPVar9 != (PrimRefMB *)0x0) {
          if (sVar34 * 0x50 < 0x1c00000) {
            alignedFree(pPVar9);
          }
          else {
            os_free(pPVar9,sVar34 * 0x50,(pvVar38->alloc).hugepages);
          }
        }
        in_00 = local_1e38;
        if (sVar34 != 0) {
          pMVar10 = (pvVar38->alloc).device;
          (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar34 * -0x50,1);
          in_00 = local_1e38;
        }
        pvVar38->size_active = 0;
        pvVar38->size_alloced = 0;
        pvVar38->items = (PrimRefMB *)0x0;
      }
      local_1e38 = in_00;
      ::operator_delete(pvVar38);
      in_00 = local_1e38;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }